

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse.cpp
# Opt level: O0

void reverse(void)

{
  allocator<std::array<Rgba,_4UL>_> *this;
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  initializer_list<std::array<Rgba,_4UL>_> __l;
  undefined1 uVar4;
  undefined8 uVar5;
  bool bVar6;
  byte bVar7;
  ushort uVar8;
  uint uVar9;
  _Ios_Openmode _Var10;
  int iVar11;
  undefined8 uVar12;
  path *ppVar13;
  size_type sVar14;
  reference pvVar15;
  ulong uVar16;
  undefined4 extraout_var;
  streambuf *psVar17;
  pointer pvVar18;
  size_type sVar19;
  iterator __first;
  iterator pvVar20;
  size_type sVar21;
  size_type sVar22;
  byte *pbVar23;
  undefined4 extraout_var_00;
  char *pcVar24;
  int *piVar25;
  char *pcVar26;
  long lVar27;
  uchar *puVar28;
  vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
  *pvVar29;
  reference pvVar30;
  byte *pbVar31;
  const_reference pvVar32;
  uint8_t *puVar33;
  bool bVar34;
  anon_class_16_2_de2db67f __gen;
  const_pointer local_750;
  uint local_73c;
  uint local_72c;
  size_type local_728;
  Rgba *pixel;
  uint8_t bit1;
  uint8_t bit0;
  uint8_t *puStack_5c8;
  uint8_t x;
  uint8_t *ptr;
  uint8_t bitplane1;
  uint8_t bitplane0;
  uint8_t realY;
  uint8_t y;
  value_type *palette_1;
  uint8_t *tileData;
  size_t palID;
  size_t tileID;
  bool bank_1;
  uint8_t attribute;
  size_t index;
  size_t tx;
  size_t ty;
  uint8_t *rowPtrs [8];
  allocator<unsigned_char> local_52a;
  value_type_conflict local_529;
  undefined1 local_528 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> tileRow;
  size_t SIZEOF_ROW;
  uint8_t SIZEOF_PIXEL;
  long lStack_500;
  png_color_8 sbitChunk;
  png_infop pngInfo;
  long local_4d8;
  png_structp png;
  undefined1 local_4b0 [8];
  File pngFile;
  DefaultInitVec<uint8_t> local_390;
  undefined1 local_378 [8];
  optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  palmap;
  iterator iStack_350;
  uchar id_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
  *__range3_1;
  bool bank;
  uchar *attr_1;
  uchar *id;
  undefined1 local_310 [8];
  Zip<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  __end3;
  Zip<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  __begin3;
  ZipContainer<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_&,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_&>
  *__range3;
  iterator iStack_2d0;
  uchar attr;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
  *__range2;
  undefined1 local_2b0 [7];
  bool bad;
  DefaultInitVec<uint8_t> local_288;
  undefined1 local_270 [8];
  optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  attrmap;
  value_type *palette;
  size_t nbRead;
  array<unsigned_char,_8UL> buf;
  undefined1 local_208 [8];
  File file;
  array<Rgba,_4UL> local_108;
  iterator local_f8;
  size_type local_f0;
  undefined1 local_e8 [8];
  vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_> palettes;
  size_t height;
  size_t width;
  DefaultInitVec<uint8_t> local_98;
  undefined1 local_80 [8];
  optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  tilemap;
  size_t nbTileInstances;
  uint8_t tileSize;
  path local_48;
  undefined1 local_20 [8];
  DefaultInitVec<uint8_t> tiles;
  
  uVar12 = png_get_libpng_ver(0);
  Options::verbosePrint(&options,'\x01',"Using libpng %s\n",uVar12);
  bVar6 = std::optional<std::filesystem::__cxx11::path>::has_value(&options.output);
  if (!bVar6) {
    fatal("Tile data must be provided when reversing an image!");
  }
  if (((options.allowDedup & 1U) != 0) &&
     (bVar6 = std::optional<std::filesystem::__cxx11::path>::has_value(&options.tilemap), !bVar6)) {
    warning("Tile deduplication is enabled, but no tilemap is provided?");
  }
  if ((options.useColorCurve & 1U) != 0) {
    warning("The color curve is not yet supported in reverse mode...");
  }
  if (((options.inputSlice.left != 0) || (options.inputSlice.top != 0)) ||
     (options.inputSlice.height != 0)) {
    warning("\"Sliced-off\" pixels are ignored in reverse mode");
  }
  if ((options.inputSlice.width != 0) &&
     ((uint)options.inputSlice.width != (uint)options.reversedWidth << 3)) {
    warning("Specified input slice width (%u) doesn\'t match provided reversing width (%u * 8)",
            (ulong)options.inputSlice.width,(ulong)options.reversedWidth);
  }
  Options::verbosePrint(&options,'\x02',"Reading tiles...\n");
  ppVar13 = std::optional<std::filesystem::__cxx11::path>::operator*(&options.output);
  std::filesystem::__cxx11::path::path(&local_48,ppVar13);
  readInto((DefaultInitVec<uint8_t> *)local_20,&local_48);
  std::filesystem::__cxx11::path::~path(&local_48);
  bVar7 = options.bitDepth << 3;
  sVar14 = std::
           vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::size((vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_20);
  if (sVar14 % (ulong)bVar7 != 0) {
    sVar14 = std::
             vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::size((vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_20);
    fatal("Tile data size (%zu bytes) is not a multiple of %u bytes",sVar14,(ulong)bVar7);
  }
  sVar14 = std::
           vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::size((vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_20);
  tilemap.
  super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._24_8_ = sVar14 / bVar7 + options.trim;
  Options::verbosePrint
            (&options,'\x03',"Read %zu tiles.\n",
             tilemap.
             super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._24_8_);
  std::
  optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::optional((optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)local_80);
  bVar6 = std::optional<std::filesystem::__cxx11::path>::has_value(&options.tilemap);
  if (bVar6) {
    ppVar13 = std::optional<std::filesystem::__cxx11::path>::operator*(&options.tilemap);
    std::filesystem::__cxx11::path::path((path *)&width,ppVar13);
    readInto(&local_98,(path *)&width);
    std::
    optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
    ::operator=((optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
                 *)local_80,&local_98);
    std::
    vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>::
    ~vector(&local_98);
    std::filesystem::__cxx11::path::~path((path *)&width);
    pvVar29 = std::
              optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator->((optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_80);
    tilemap.
    super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._24_8_ = std::
              vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::size(pvVar29);
    Options::verbosePrint
              (&options,'\x03',"Read %zu tilemap entries.\n",
               tilemap.
               super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._24_8_);
  }
  uVar12 = tilemap.
           super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._24_8_;
  if (tilemap.
      super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._24_8_ == 0) {
    fatal("Cannot generate empty image");
  }
  pvVar15 = std::array<unsigned_short,_2UL>::operator[](&options.maxNbTiles,0);
  uVar8 = *pvVar15;
  pvVar15 = std::array<unsigned_short,_2UL>::operator[](&options.maxNbTiles,1);
  uVar5 = tilemap.
          super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._24_8_;
  if ((ulong)(long)(int)((uint)uVar8 + (uint)*pvVar15) < (ulong)uVar12) {
    pvVar15 = std::array<unsigned_short,_2UL>::operator[](&options.maxNbTiles,0);
    uVar8 = *pvVar15;
    std::array<unsigned_short,_2UL>::operator[](&options.maxNbTiles,1);
    warning("Read %zu tiles, more than the limit of %zu + %zu",uVar5,(ulong)uVar8);
  }
  uVar16 = (ulong)options.reversedWidth;
  if ((ulong)tilemap.
             super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._24_8_ % uVar16 != 0) {
    fatal("Total number of tiles read (%zu) cannot be divided by image width (%zu tiles)",
          tilemap.
          super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._24_8_,uVar16);
  }
  palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)tilemap.
                        super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._24_8_ / uVar16);
  Options::verbosePrint
            (&options,'\x03',"Reversed image dimensions: %zux%zu tiles\n",uVar16,
             palettes.
             super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  Rgba::Rgba(local_108._M_elems,0xffffffff);
  Rgba::Rgba(local_108._M_elems + 1,0xaaaaaaff);
  Rgba::Rgba(local_108._M_elems + 2,0x555555ff);
  Rgba::Rgba(local_108._M_elems + 3,0xff);
  local_f8 = &local_108;
  local_f0 = 1;
  this = (allocator<std::array<Rgba,_4UL>_> *)
         ((long)&file._file.
                 super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                 .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_> +
         0xf7);
  std::allocator<std::array<Rgba,_4UL>_>::allocator(this);
  __l._M_len = local_f0;
  __l._M_array = local_f8;
  std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::vector
            ((vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_> *)local_e8,__l,
             this);
  std::allocator<std::array<Rgba,_4UL>_>::~allocator
            ((allocator<std::array<Rgba,_4UL>_> *)
             ((long)&file._file.
                     super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                     .
                     super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                     .
                     super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                     .
                     super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                     .
                     super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
             + 0xf7));
  bVar6 = std::optional<std::filesystem::__cxx11::path>::has_value(&options.palettes);
  if (bVar6) {
    File::File((File *)local_208);
    ppVar13 = std::optional<std::filesystem::__cxx11::path>::operator*(&options.palettes);
    _Var10 = std::operator|(_S_in,_S_bin);
    iVar11 = File::open((File *)local_208,(char *)ppVar13,_Var10);
    if (CONCAT44(extraout_var,iVar11) == 0) {
      ppVar13 = std::optional<std::filesystem::__cxx11::path>::operator*(&options.palettes);
      File::string((string *)&buf,(File *)local_208,ppVar13);
      pcVar24 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf);
      piVar25 = __errno_location();
      pcVar26 = strerror(*piVar25);
      fatal("Failed to open \"%s\": %s",pcVar24,pcVar26);
    }
    std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::clear
              ((vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_> *)local_e8);
    do {
      psVar17 = File::operator->((File *)local_208);
      pvVar18 = std::array<unsigned_char,_8UL>::data((array<unsigned_char,_8UL> *)&nbRead);
      std::array<unsigned_char,_8UL>::size((array<unsigned_char,_8UL> *)&nbRead);
      sVar14 = std::streambuf::sgetn((char *)psVar17,(long)pvVar18);
      sVar19 = std::array<unsigned_char,_8UL>::size((array<unsigned_char,_8UL> *)&nbRead);
      if (sVar14 == sVar19) {
        pvVar30 = std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
                  emplace_back<>((vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                                  *)local_e8);
        __first = std::array<Rgba,_4UL>::begin(pvVar30);
        pvVar20 = std::array<Rgba,_4UL>::begin(pvVar30);
        attrmap.
        super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._24_8_ = &nbRead;
        __gen._8_8_ = 0;
        __gen.buf = (array<unsigned_char,_8UL> *)
                    attrmap.
                    super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._24_8_;
        std::generate<Rgba*,reverse()::__0>(__first,pvVar20 + options.nbColorsPerPal,__gen);
      }
      else if (sVar14 != 0) {
        sVar19 = std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::size
                           ((vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                             *)local_e8);
        sVar21 = std::array<unsigned_char,_8UL>::size((array<unsigned_char,_8UL> *)&nbRead);
        sVar22 = std::array<unsigned_char,_8UL>::size((array<unsigned_char,_8UL> *)&nbRead);
        fatal("Palette data size (%zu) is not a multiple of %zu bytes!\n",sVar19 * sVar21 + sVar14,
              sVar22);
      }
    } while (sVar14 != 0);
    sVar14 = std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::size
                       ((vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_> *)
                        local_e8);
    if (options.nbPalettes < sVar14) {
      sVar14 = std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::size
                         ((vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_> *)
                          local_e8);
      warning("Read %zu palettes, more than the specified limit of %zu",sVar14,
              (ulong)options.nbPalettes);
    }
    if ((options.palSpecType == EXPLICIT) &&
       (bVar6 = std::operator==((vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                                 *)local_e8,&options.palSpec), ((bVar6 ^ 0xffU) & 1) != 0)) {
      warning("Colors in the palette file do not match those specified with `-c`!");
    }
    File::~File((File *)local_208);
  }
  else if (options.palSpecType == EMBEDDED) {
    warning(
           "An embedded palette was requested, but no palette file was specified; ignoring request."
           );
  }
  else if (options.palSpecType == EXPLICIT) {
    std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::operator=
              ((vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_> *)local_e8,
               &options.palSpec);
  }
  std::
  optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::optional((optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)local_270);
  bVar6 = std::optional<std::filesystem::__cxx11::path>::has_value(&options.attrmap);
  if (bVar6) {
    ppVar13 = std::optional<std::filesystem::__cxx11::path>::operator*(&options.attrmap);
    std::filesystem::__cxx11::path::path((path *)local_2b0,ppVar13);
    readInto(&local_288,(path *)local_2b0);
    std::
    optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
    ::operator=((optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
                 *)local_270,&local_288);
    std::
    vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>::
    ~vector(&local_288);
    std::filesystem::__cxx11::path::~path((path *)local_2b0);
    pvVar29 = std::
              optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator->((optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_270);
    sVar14 = std::
             vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::size(pvVar29);
    if (sVar14 != tilemap.
                  super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._24_8_) {
      pvVar29 = std::
                optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator->((optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_270);
      sVar14 = std::
               vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::size(pvVar29);
      fatal("Attribute map size (%zu tiles) doesn\'t match image\'s (%zu)",sVar14,
            tilemap.
            super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._24_8_);
    }
    bVar6 = false;
    pvVar29 = std::
              optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*((optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)local_270);
    __end2 = std::
             vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::begin(pvVar29);
    iStack_2d0 = std::
                 vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::end(pvVar29);
    while (bVar34 = __gnu_cxx::
                    operator==<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              (&__end2,&stack0xfffffffffffffd30), ((bVar34 ^ 0xffU) & 1) != 0) {
      pbVar31 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&__end2);
      bVar1 = *pbVar31;
      sVar14 = std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::size
                         ((vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_> *)
                          local_e8);
      if (sVar14 < (ulong)(long)(int)(bVar1 & 7)) {
        error("Referencing palette %u, but there are only %zu!");
        bVar6 = true;
      }
      if (((bVar1 & 8) != 0) &&
         (bVar34 = std::optional::operator_cast_to_bool((optional *)local_80), !bVar34)) {
        warning("Tile in bank 1 but no tilemap specified; ignoring the bank bit");
      }
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator++(&__end2);
    }
    if (bVar6) {
      giveUp();
    }
  }
  bVar6 = std::optional::operator_cast_to_bool((optional *)local_80);
  if (bVar6) {
    bVar6 = std::optional::operator_cast_to_bool((optional *)local_270);
    if (bVar6) {
      pvVar29 = std::
                optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)local_80);
      std::
      optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator*((optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)local_270);
      zip<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>&,std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>&>
                ((vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&__begin3._iters.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_false>
                 ,pvVar29);
      detail::
      ZipContainer<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_&,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_&>
      ::begin((ZipContainer<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_&,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_&>
               *)&__end3._iters.
                  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  .
                  super__Head_base<0UL,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_false>
             );
      detail::
      ZipContainer<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_&,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_&>
      ::end((ZipContainer<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_&,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_&>
             *)local_310);
      while (bVar6 = operator!=((Zip<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                 *)&__end3._iters.
                                    super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                    .
                                    super__Head_base<0UL,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_false>
                                ,(Zip<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                  *)local_310), bVar6) {
        Zip<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::operator*((Zip<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     *)&id);
        pbVar31 = std::get<0ul,unsigned_char&,unsigned_char&>
                            ((tuple<unsigned_char_&,_unsigned_char_&> *)&id);
        pbVar23 = std::get<1ul,unsigned_char&,unsigned_char&>
                            ((tuple<unsigned_char_&,_unsigned_char_&> *)&id);
        bVar6 = (*pbVar23 & 8) != 0;
        bVar1 = *pbVar31;
        pvVar15 = std::array<unsigned_short,_2UL>::operator[](&options.maxNbTiles,(ulong)bVar6);
        if (*pvVar15 <= (ushort)bVar1) {
          bVar1 = *pbVar31;
          uVar9 = (uint)bVar6;
          pvVar15 = std::array<unsigned_short,_2UL>::operator[](&options.maxNbTiles,(ulong)uVar9);
          warning("Tile #%u was referenced, but the limit for bank %u is %u",(ulong)bVar1,
                  (ulong)uVar9,(ulong)*pvVar15);
        }
        Zip<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::operator++((Zip<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)&__end3._iters.
                         super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         .
                         super__Head_base<0UL,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_false>
                    );
      }
    }
    else {
      pvVar29 = std::
                optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)local_80);
      __end3_1 = std::
                 vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::begin(pvVar29);
      iStack_350 = std::
                   vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::end(pvVar29);
      while (bVar6 = __gnu_cxx::
                     operator==<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               (&__end3_1,&stack0xfffffffffffffcb0), ((bVar6 ^ 0xffU) & 1) != 0) {
        pbVar31 = __gnu_cxx::
                  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*(&__end3_1);
        palmap.
        super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._31_1_ = *pbVar31;
        uVar8 = (ushort)(byte)palmap.
                              super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._31_1_;
        pvVar15 = std::array<unsigned_short,_2UL>::operator[](&options.maxNbTiles,0);
        uVar4 = palmap.
                super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._31_1_;
        if (*pvVar15 <= uVar8) {
          pvVar15 = std::array<unsigned_short,_2UL>::operator[](&options.maxNbTiles,0);
          warning("Tile #%u was referenced, but the limit is %u",(ulong)(byte)uVar4,(ulong)*pvVar15)
          ;
        }
        __gnu_cxx::
        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator++(&__end3_1);
      }
    }
  }
  std::
  optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::optional((optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)local_378);
  bVar6 = std::optional<std::filesystem::__cxx11::path>::has_value(&options.palmap);
  if (bVar6) {
    ppVar13 = std::optional<std::filesystem::__cxx11::path>::operator*(&options.palmap);
    std::filesystem::__cxx11::path::path
              ((path *)((long)&pngFile._file.
                               super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                               .
                               super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                               .
                               super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                               .
                               super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                               .
                               super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                       + 0xf0),ppVar13);
    readInto(&local_390,
             (path *)((long)&pngFile._file.
                             super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                             .
                             super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                             .
                             super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                     + 0xf0));
    std::
    optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
    ::operator=((optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
                 *)local_378,&local_390);
    std::
    vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>::
    ~vector(&local_390);
    std::filesystem::__cxx11::path::~path
              ((path *)((long)&pngFile._file.
                               super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                               .
                               super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                               .
                               super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                               .
                               super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                               .
                               super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                       + 0xf0));
    pvVar29 = std::
              optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator->((optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_378);
    sVar14 = std::
             vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::size(pvVar29);
    if (sVar14 != tilemap.
                  super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._24_8_) {
      pvVar29 = std::
                optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator->((optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_378);
      sVar14 = std::
               vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::size(pvVar29);
      fatal("Palette map size (%zu tiles) doesn\'t match image\'s (%zu)",sVar14,
            tilemap.
            super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._24_8_);
    }
  }
  Options::verbosePrint(&options,'\x02',"Writing image...\n");
  File::File((File *)local_4b0);
  ppVar13 = std::optional<std::filesystem::__cxx11::path>::operator*(&options.input);
  _Var10 = std::operator|(_S_out,_S_bin);
  iVar11 = File::open((File *)local_4b0,(char *)ppVar13,_Var10);
  if (CONCAT44(extraout_var_00,iVar11) != 0) {
    ppVar13 = std::optional<std::filesystem::__cxx11::path>::operator*(&options.input);
    File::string((string *)&pngInfo,(File *)local_4b0,ppVar13);
    pcVar24 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &pngInfo);
    lVar27 = png_create_write_struct("1.6.37",pcVar24,pngError,pngWarning);
    std::__cxx11::string::~string((string *)&pngInfo);
    local_4d8 = lVar27;
    if (lVar27 == 0) {
      piVar25 = __errno_location();
      pcVar24 = strerror(*piVar25);
      fatal("Couldn\'t create PNG write struct: %s",pcVar24);
    }
    lStack_500 = png_create_info_struct(lVar27);
    if (lStack_500 != 0) {
      png_set_write_fn(local_4d8,local_4b0,writePng,flushPng);
      png_set_IHDR(local_4d8,lStack_500,(ulong)options.reversedWidth << 3,
                   (int)palettes.
                        super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage << 3,8,6,0,0,0);
      png_write_info(local_4d8,lStack_500);
      SIZEOF_ROW._3_1_ = 5;
      SIZEOF_ROW._4_1_ = 5;
      SIZEOF_ROW._5_1_ = 5;
      SIZEOF_ROW._7_1_ = 1;
      png_set_sBIT(local_4d8,lStack_500,(long)&SIZEOF_ROW + 3);
      SIZEOF_ROW._2_1_ = 4;
      uVar3 = (ulong)options.reversedWidth;
      tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(uVar3 << 5);
      local_529 = 0xff;
      std::allocator<unsigned_char>::allocator(&local_52a);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_528,uVar3 << 8,
                 &local_529,&local_52a);
      std::allocator<unsigned_char>::~allocator(&local_52a);
      ty = (size_t)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_528);
      puVar28 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_528);
      rowPtrs[0] = puVar28 + (long)tileRow.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
      puVar28 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_528);
      rowPtrs[1] = puVar28 + (long)tileRow.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage * 2;
      puVar28 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_528);
      rowPtrs[2] = puVar28 + (long)tileRow.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage * 3;
      puVar28 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_528);
      rowPtrs[3] = puVar28 + (long)tileRow.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage * 4;
      puVar28 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_528);
      rowPtrs[4] = puVar28 + (long)tileRow.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage * 5;
      puVar28 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_528);
      rowPtrs[5] = puVar28 + (long)tileRow.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage * 6;
      puVar28 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_528);
      rowPtrs[6] = puVar28 + (long)tileRow.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage * 7;
      tx = 0;
      do {
        if (palettes.
            super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage <= tx) {
          png_write_end(local_4d8,lStack_500);
          iVar11 = (int)&stack0xfffffffffffffb00;
          png_destroy_write_struct(&local_4d8);
          File::close((File *)local_4b0,iVar11);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_528);
          File::~File((File *)local_4b0);
          std::
          optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~optional((optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)local_378);
          std::
          optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~optional((optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)local_270);
          std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::~vector
                    ((vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_> *)
                     local_e8);
          std::
          optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~optional((optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)local_80);
          std::
          vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~vector((vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_20);
          return;
        }
        for (index = 0; index < uVar16; index = index + 1) {
          if ((options.columnMajor & 1U) == 0) {
            local_728 = tx * uVar16 + index;
          }
          else {
            local_728 = tx + index * uVar16;
          }
          bVar6 = std::
                  optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::has_value((optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)local_270);
          if (bVar6) {
            pvVar29 = std::
                      optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator*((optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)local_270);
            pbVar31 = std::
                      vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator[](pvVar29,local_728);
            local_72c = (uint)*pbVar31;
          }
          else {
            local_72c = 0;
          }
          bVar34 = (local_72c & 8) != 0;
          palID = local_728;
          bVar6 = std::
                  optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::has_value((optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)local_80);
          if (bVar6) {
            pvVar29 = std::
                      optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator*((optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)local_80);
            pbVar31 = std::
                      vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator[](pvVar29,local_728);
            bVar1 = *pbVar31;
            pbVar31 = std::array<unsigned_char,_2UL>::operator[](&options.baseTileIDs,(ulong)bVar34)
            ;
            bVar2 = *pbVar31;
            pvVar15 = std::array<unsigned_short,_2UL>::operator[](&options.maxNbTiles,0);
            palID = (size_t)(int)(((uint)bVar1 - (uint)bVar2) + (uint)bVar34 * (uint)*pvVar15);
          }
          if ((ulong)tilemap.
                     super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._24_8_ <= palID) {
            __assert_fail("tileID < nbTileInstances",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/reverse.cpp"
                          ,0x125,"reverse");
          }
          bVar6 = std::optional::operator_cast_to_bool((optional *)local_378);
          if (bVar6) {
            pvVar29 = std::
                      optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator*((optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)local_378);
            pbVar31 = std::
                      vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator[](pvVar29,local_728);
            local_73c = (uint)*pbVar31;
          }
          else {
            local_73c = local_72c & 7;
          }
          sVar14 = std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::size
                             ((vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                               *)local_e8);
          if (sVar14 <= (ulong)(long)(int)local_73c) {
            __assert_fail("palID < palettes.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/reverse.cpp"
                          ,0x127,"reverse");
          }
          if (tilemap.
              super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._24_8_ - options.trim < palID) {
            local_750 = std::array<unsigned_char,_16UL>::data(&reverse::trimmedTile);
          }
          else {
            local_750 = std::
                        vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator[]((vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      *)local_20,palID * bVar7);
          }
          pvVar30 = std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
                    operator[]((vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                                *)local_e8,(long)(int)local_73c);
          for (ptr._7_1_ = 0; ptr._7_1_ < 8; ptr._7_1_ = ptr._7_1_ + 1) {
            bVar1 = ptr._7_1_;
            if ((local_72c & 0x40) != 0) {
              bVar1 = 7 - ptr._7_1_;
            }
            ptr._5_1_ = local_750[(byte)(bVar1 * options.bitDepth)];
            ptr._4_1_ = local_750[(int)((uint)(byte)(bVar1 * options.bitDepth) +
                                       (int)(1 % (ulong)(long)(int)(uint)options.bitDepth))];
            if ((local_72c & 0x20) != 0) {
              pbVar31 = std::array<unsigned_char,_256UL>::operator[](&flipTable,(ulong)ptr._5_1_);
              ptr._5_1_ = *pbVar31;
              pbVar31 = std::array<unsigned_char,_256UL>::operator[](&flipTable,(ulong)ptr._4_1_);
              ptr._4_1_ = *pbVar31;
            }
            puStack_5c8 = rowPtrs[(ulong)ptr._7_1_ - 1] + index * 0x20;
            for (pixel._7_1_ = 0; pixel._7_1_ < 8; pixel._7_1_ = pixel._7_1_ + 1) {
              pvVar32 = std::array<Rgba,_4UL>::operator[]
                                  (pvVar30,(long)((int)(uint)(ptr._5_1_ & 0x80) >> 7 |
                                                 (int)(uint)(ptr._4_1_ & 0x80) >> 6));
              *puStack_5c8 = pvVar32->red;
              puStack_5c8[1] = pvVar32->green;
              puVar33 = puStack_5c8 + 3;
              puStack_5c8[2] = pvVar32->blue;
              puStack_5c8 = puStack_5c8 + 4;
              *puVar33 = pvVar32->alpha;
              ptr._5_1_ = ptr._5_1_ << 1;
              ptr._4_1_ = ptr._4_1_ << 1;
            }
          }
        }
        png_write_rows(local_4d8,&ty,8);
        tx = tx + 1;
      } while( true );
    }
    piVar25 = __errno_location();
    pcVar24 = strerror(*piVar25);
    fatal("Couldn\'t create PNG info struct: %s",pcVar24);
  }
  ppVar13 = std::optional<std::filesystem::__cxx11::path>::operator*(&options.input);
  File::string((string *)&png,(File *)local_4b0,ppVar13);
  pcVar24 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&png);
  piVar25 = __errno_location();
  pcVar26 = strerror(*piVar25);
  fatal("Failed to create \"%s\": %s",pcVar24,pcVar26);
}

Assistant:

void reverse() {
	options.verbosePrint(Options::VERB_CFG, "Using libpng %s\n", png_get_libpng_ver(nullptr));

	// Check for weird flag combinations

	if (!options.output.has_value()) {
		fatal("Tile data must be provided when reversing an image!");
	}

	if (options.allowDedup && !options.tilemap.has_value()) {
		warning("Tile deduplication is enabled, but no tilemap is provided?");
	}

	if (options.useColorCurve) {
		warning("The color curve is not yet supported in reverse mode...");
	}

	if (options.inputSlice.left != 0 || options.inputSlice.top != 0
	    || options.inputSlice.height != 0) {
		warning("\"Sliced-off\" pixels are ignored in reverse mode");
	}
	if (options.inputSlice.width != 0 && options.inputSlice.width != options.reversedWidth * 8) {
		warning("Specified input slice width (%" PRIu16
		        ") doesn't match provided reversing width (%" PRIu8 " * 8)",
		        options.inputSlice.width, options.reversedWidth);
	}

	options.verbosePrint(Options::VERB_LOG_ACT, "Reading tiles...\n");
	auto const tiles = readInto(*options.output);
	uint8_t tileSize = 8 * options.bitDepth;
	if (tiles.size() % tileSize != 0) {
		fatal("Tile data size (%zu bytes) is not a multiple of %" PRIu8 " bytes",
		      tiles.size(), tileSize);
	}

	// By default, assume tiles are not deduplicated, and add the (allegedly) trimmed tiles
	size_t nbTileInstances = tiles.size() / tileSize + options.trim; // Image size in tiles
	options.verbosePrint(Options::VERB_INTERM, "Read %zu tiles.\n", nbTileInstances);
	std::optional<DefaultInitVec<uint8_t>> tilemap;
	if (options.tilemap.has_value()) {
		tilemap = readInto(*options.tilemap);
		nbTileInstances = tilemap->size();
		options.verbosePrint(Options::VERB_INTERM, "Read %zu tilemap entries.\n", nbTileInstances);
	}

	if (nbTileInstances == 0) {
		fatal("Cannot generate empty image");
	}
	if (nbTileInstances > options.maxNbTiles[0] + options.maxNbTiles[1]) {
		warning("Read %zu tiles, more than the limit of %zu + %zu", nbTileInstances,
		        options.maxNbTiles[0], options.maxNbTiles[1]);
	}

	size_t width = options.reversedWidth, height; // In tiles
	if (nbTileInstances % width != 0) {
		fatal("Total number of tiles read (%zu) cannot be divided by image width (%zu tiles)",
		      nbTileInstances, width);
	}
	height = nbTileInstances / width;

	options.verbosePrint(Options::VERB_INTERM, "Reversed image dimensions: %zux%zu tiles\n", width,
	                     height);

	// TODO: -U

	std::vector<std::array<Rgba, 4>> palettes{
	    {Rgba(0xFFFFFFFF), Rgba(0xAAAAAAFF), Rgba(0x555555FF), Rgba(0x000000FF)}
	};
	// If a palette file is used as input, it overrides the default colours.
	if (options.palettes.has_value()) {
		File file;
		if (!file.open(*options.palettes, std::ios::in | std::ios::binary)) {
			fatal("Failed to open \"%s\": %s", file.string(*options.palettes).c_str(),
			      strerror(errno));
		}

		palettes.clear();
		std::array<uint8_t, sizeof(uint16_t) * 4> buf; // 4 colors
		size_t nbRead;
		do {
			nbRead = file->sgetn(reinterpret_cast<char *>(buf.data()), buf.size());
			if (nbRead == buf.size()) {
				// Expand the colors
				auto &palette = palettes.emplace_back();
				std::generate(palette.begin(), palette.begin() + options.nbColorsPerPal,
				              [&buf, i = 0]() mutable {
					              i += 2;
					              return Rgba::fromCGBColor(buf[i - 2] + (buf[i - 1] << 8));
				              });
			} else if (nbRead != 0) {
				fatal("Palette data size (%zu) is not a multiple of %zu bytes!\n",
				      palettes.size() * buf.size() + nbRead, buf.size());
			}
		} while (nbRead != 0);

		if (palettes.size() > options.nbPalettes) {
			warning("Read %zu palettes, more than the specified limit of %zu", palettes.size(),
			        options.nbPalettes);
		}

		if (options.palSpecType == Options::EXPLICIT && palettes != options.palSpec) {
			warning("Colors in the palette file do not match those specified with `-c`!");
		}
	} else if (options.palSpecType == Options::EMBEDDED) {
		warning("An embedded palette was requested, but no palette file was specified; ignoring request.");
	} else if (options.palSpecType == Options::EXPLICIT) {
		palettes = std::move(options.palSpec); // We won't be using it again.
	}

	std::optional<DefaultInitVec<uint8_t>> attrmap;
	if (options.attrmap.has_value()) {
		attrmap = readInto(*options.attrmap);
		if (attrmap->size() != nbTileInstances) {
			fatal("Attribute map size (%zu tiles) doesn't match image's (%zu)", attrmap->size(),
			      nbTileInstances);
		}

		// Scan through the attributes for inconsistencies
		// We do this now for two reasons:
		// 1. Checking those during the main loop is harmful to optimization, and
		// 2. It clutters the code more, and it's not in great shape to begin with
		bool bad = false;
		for (auto attr : *attrmap) {
			if ((attr & 0b111) > palettes.size()) {
				error("Referencing palette %u, but there are only %zu!");
				bad = true;
			}
			if (attr & 0x08 && !tilemap) {
				warning("Tile in bank 1 but no tilemap specified; ignoring the bank bit");
			}
		}
		if (bad) {
			giveUp();
		}
	}

	if (tilemap) {
		if (attrmap) {
			for (auto [id, attr] : zip(*tilemap, *attrmap)) {
				bool bank = attr & 1 << 3;
				if (id >= options.maxNbTiles[bank]) {
					warning("Tile #%" PRIu8
					        " was referenced, but the limit for bank %u is %" PRIu16,
					        id, bank, options.maxNbTiles[bank]);
				}
			}
		} else {
			for (auto id : *tilemap) {
				if (id >= options.maxNbTiles[0]) {
					warning("Tile #%" PRIu8 " was referenced, but the limit is %" PRIu16, id,
					        options.maxNbTiles[0]);
				}
			}
		}
	}

	std::optional<DefaultInitVec<uint8_t>> palmap;
	if (options.palmap.has_value()) {
		palmap = readInto(*options.palmap);
		if (palmap->size() != nbTileInstances) {
			fatal("Palette map size (%zu tiles) doesn't match image's (%zu)", palmap->size(),
			      nbTileInstances);
		}
	}

	options.verbosePrint(Options::VERB_LOG_ACT, "Writing image...\n");
	File pngFile;
	if (!pngFile.open(*options.input, std::ios::out | std::ios::binary)) {
		fatal("Failed to create \"%s\": %s", pngFile.string(*options.input).c_str(),
		      strerror(errno));
	}
	png_structp png = png_create_write_struct(
	    PNG_LIBPNG_VER_STRING,
	    const_cast<png_voidp>(static_cast<void const *>(pngFile.string(*options.input).c_str())),
	    pngError, pngWarning);
	if (!png) {
		fatal("Couldn't create PNG write struct: %s", strerror(errno));
	}
	png_infop pngInfo = png_create_info_struct(png);
	if (!pngInfo) {
		fatal("Couldn't create PNG info struct: %s", strerror(errno));
	}
	png_set_write_fn(png, &pngFile, writePng, flushPng);

	png_set_IHDR(png, pngInfo, options.reversedWidth * 8, height * 8, 8, PNG_COLOR_TYPE_RGB_ALPHA,
	             PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);
	png_write_info(png, pngInfo);

	png_color_8 sbitChunk;
	sbitChunk.red = 5;
	sbitChunk.green = 5;
	sbitChunk.blue = 5;
	sbitChunk.alpha = 1;
	png_set_sBIT(png, pngInfo, &sbitChunk);

	constexpr uint8_t SIZEOF_PIXEL = 4; // Each pixel is 4 bytes (RGBA @ 8 bits/component)
	size_t const SIZEOF_ROW = options.reversedWidth * 8 * SIZEOF_PIXEL;
	std::vector<uint8_t> tileRow(8 * SIZEOF_ROW, 0xFF); // Data for 8 rows of pixels
	uint8_t * const rowPtrs[8] = {
	    &tileRow.data()[0 * SIZEOF_ROW], &tileRow.data()[1 * SIZEOF_ROW],
	    &tileRow.data()[2 * SIZEOF_ROW], &tileRow.data()[3 * SIZEOF_ROW],
	    &tileRow.data()[4 * SIZEOF_ROW], &tileRow.data()[5 * SIZEOF_ROW],
	    &tileRow.data()[6 * SIZEOF_ROW], &tileRow.data()[7 * SIZEOF_ROW],
	};

	for (size_t ty = 0; ty < height; ++ty) {
		for (size_t tx = 0; tx < width; ++tx) {
			size_t index = options.columnMajor ? ty + tx * width : ty * width + tx;
			// By default, a tile is unflipped, in bank 0, and uses palette #0
			uint8_t attribute = attrmap.has_value() ? (*attrmap)[index] : 0x00;
			bool bank = attribute & 0x08;
			// Get the tile ID at this location
			size_t tileID = index;
			if (tilemap.has_value()) {
				tileID =
				    (*tilemap)[index] - options.baseTileIDs[bank] + bank * options.maxNbTiles[0];
			}
			assert(tileID < nbTileInstances); // Should have been checked earlier
			size_t palID = palmap ? (*palmap)[index] : attribute & 0b111;
			assert(palID < palettes.size()); // Should be ensured on data read

			// We do not have data for tiles trimmed with `-x`, so assume they are "blank"
			static std::array<uint8_t, 16> const trimmedTile{
			    0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
			    0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
			};
			uint8_t const *tileData = tileID > nbTileInstances - options.trim
			                              ? trimmedTile.data()
			                              : &tiles[tileID * tileSize];
			auto const &palette = palettes[palID];
			for (uint8_t y = 0; y < 8; ++y) {
				// If vertically mirrored, fetch the bytes from the other end
				uint8_t realY = (attribute & 0x40 ? 7 - y : y) * options.bitDepth;
				uint8_t bitplane0 = tileData[realY];
				uint8_t bitplane1 = tileData[realY + 1 % options.bitDepth];
				if (attribute & 0x20) { // Handle horizontal flip
					bitplane0 = flipTable[bitplane0];
					bitplane1 = flipTable[bitplane1];
				}
				uint8_t *ptr = &rowPtrs[y][tx * 8 * SIZEOF_PIXEL];
				for (uint8_t x = 0; x < 8; ++x) {
					uint8_t bit0 = bitplane0 & 0x80, bit1 = bitplane1 & 0x80;
					Rgba const &pixel = palette[bit0 >> 7 | bit1 >> 6];
					*ptr++ = pixel.red;
					*ptr++ = pixel.green;
					*ptr++ = pixel.blue;
					*ptr++ = pixel.alpha;

					// Shift the pixel out
					bitplane0 <<= 1;
					bitplane1 <<= 1;
				}
			}
		}
		// We never modify the pointers, and neither should libpng, despite the overly lax function
		// signature.
		// (AIUI, casting away const-ness is okay as long as you don't actually modify the
		// pointed-to data)
		png_write_rows(png, const_cast<png_bytepp>(rowPtrs), 8);
	}

	// Finalize the write
	png_write_end(png, pngInfo);

	png_destroy_write_struct(&png, &pngInfo);
	pngFile.close();
}